

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O2

listen_endpoint_t * __thiscall
libtorrent::aux::listen_endpoint_t::operator=(listen_endpoint_t *this,listen_endpoint_t *param_1)

{
  undefined8 uVar1;
  address_v4 aVar2;
  listen_socket_flags_t lVar3;
  
  aVar2.addr_.s_addr = (param_1->addr).ipv4_address_.addr_;
  (this->addr).type_ = (param_1->addr).type_;
  (this->addr).ipv4_address_ = (address_v4)aVar2.addr_.s_addr;
  uVar1 = *(undefined8 *)((long)&(param_1->addr).ipv6_address_.addr_.__in6_u + 8);
  *(undefined8 *)&(this->addr).ipv6_address_.addr_.__in6_u =
       *(undefined8 *)&(param_1->addr).ipv6_address_.addr_.__in6_u;
  *(undefined8 *)((long)&(this->addr).ipv6_address_.addr_.__in6_u + 8) = uVar1;
  (this->addr).ipv6_address_.scope_id_ = (param_1->addr).ipv6_address_.scope_id_;
  aVar2.addr_.s_addr = (param_1->netmask).ipv4_address_.addr_;
  (this->netmask).type_ = (param_1->netmask).type_;
  (this->netmask).ipv4_address_ = (address_v4)aVar2.addr_.s_addr;
  uVar1 = *(undefined8 *)((long)&(param_1->netmask).ipv6_address_.addr_.__in6_u + 8);
  *(undefined8 *)&(this->netmask).ipv6_address_.addr_.__in6_u =
       *(undefined8 *)&(param_1->netmask).ipv6_address_.addr_.__in6_u;
  *(undefined8 *)((long)&(this->netmask).ipv6_address_.addr_.__in6_u + 8) = uVar1;
  (this->netmask).ipv6_address_.scope_id_ = (param_1->netmask).ipv6_address_.scope_id_;
  this->port = param_1->port;
  std::__cxx11::string::operator=((string *)&this->device,(string *)&param_1->device);
  lVar3.m_val = (param_1->flags).m_val;
  this->ssl = param_1->ssl;
  this->flags = (listen_socket_flags_t)lVar3.m_val;
  return this;
}

Assistant:

struct TORRENT_EXTRA_EXPORT listen_endpoint_t
		{
			listen_endpoint_t(address const& adr, int p, std::string dev, transport s
				, listen_socket_flags_t f, address const& nmask = address{})
				: addr(adr), netmask(nmask), port(p), device(std::move(dev)), ssl(s), flags(f) {}

			bool operator==(listen_endpoint_t const& o) const
			{
				return addr == o.addr
					&& port == o.port
					&& device == o.device
					&& ssl == o.ssl
					&& flags == o.flags;
			}

			address addr;
			// if this listen endpoint/interface doesn't have a gateway, we cannot
			// route outside of our network, this netmask defines the range of our
			// local network
			address netmask;
			int port;
			std::string device;
			transport ssl;
			listen_socket_flags_t flags;
		}